

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O0

ConeArgs * __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::CheckNorm2_Pow<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>>
          (Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConstraintLocationHelper<mp::BasicConstraintKeeper> *ci,int res_var)

{
  initializer_list<int> __l;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  QuadAndLinTerms *pQVar6;
  undefined4 in_ECX;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  ConeArgs *in_RDI;
  double dVar7;
  double *c;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range6;
  size_t i;
  QuadTerms *qpterms;
  Arguments *args_qdc;
  QuadraticFunctionalConstraint *con_qdc;
  ConInfo *ie_pow;
  value_type arg_pow;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  *con_pow;
  ConeArgs *result;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffe80;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  QuadTerms *in_stack_fffffffffffffe98;
  iterator piVar8;
  size_type in_stack_fffffffffffffea0;
  undefined4 local_128;
  value_type local_124;
  undefined4 *local_120;
  undefined8 local_118;
  int local_e8 [6];
  reference local_d0;
  double *local_c8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_c0;
  vector<double,_std::allocator<double>_> *local_b8;
  undefined1 local_59;
  size_t local_58;
  QuadTerms *local_50;
  AlgebraicExpression<mp::QuadAndLinTerms> *local_48;
  QuadraticFunctionalConstraint *local_40;
  ConInfo *local_38;
  value_type local_2c;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  *local_28;
  undefined4 local_1c;
  
  local_1c = in_ECX;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::MC(in_RSI);
  local_28 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             GetConstraint<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                       (in_stack_fffffffffffffe80,
                        (ConInfo *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>::
  GetArguments(&local_28->
                super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
              );
  pvVar4 = std::array<int,_1UL>::operator[]
                     ((array<int,_1UL> *)in_stack_fffffffffffffe80,
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_2c = *pvVar4;
  CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>::
  GetParameters(&local_28->
                 super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
               );
  pvVar5 = std::array<double,_1UL>::operator[]
                     ((array<double,_1UL> *)in_stack_fffffffffffffe80,
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if ((*pvVar5 == 0.5) && (!NAN(*pvVar5))) {
    MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::MC(in_RSI);
    bVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::HasInitExpression(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    if (bVar1) {
      MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::MC(in_RSI);
      local_38 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ::GetInitExpression(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::MC(in_RSI);
      bVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::IsConInfoType<mp::QuadraticFunctionalConstraint>
                        (in_stack_fffffffffffffe80,
                         (ConInfo *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (bVar1) {
        MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ::MC(in_RSI);
        local_40 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   ::GetConstraint<mp::QuadraticFunctionalConstraint>
                             (in_stack_fffffffffffffe80,
                              (ConInfo *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_48 = QuadraticFunctionalConstraint::GetArguments
                             ((QuadraticFunctionalConstraint *)0x66a84d);
        dVar7 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(local_48);
        if (0.0 <= dVar7) {
          pQVar6 = AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(local_48);
          QuadAndLinTerms::GetLinTerms(pQVar6);
          bVar1 = LinTerms::empty((LinTerms *)0x66a88c);
          if (bVar1) {
            pQVar6 = AlgebraicExpression<mp::QuadAndLinTerms>::GetBody(local_48);
            local_50 = QuadAndLinTerms::GetQPTerms(pQVar6);
            local_58 = QuadTerms::size((QuadTerms *)0x66a8bf);
            do {
              if (local_58 == 0) {
                local_59 = 0;
                local_58 = local_58 - 1;
                Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                ::ConeArgs::ConeArgs((ConeArgs *)in_stack_fffffffffffffe80);
                QuadTerms::coefs(in_stack_fffffffffffffe98);
                mp::ArrayRef::operator_cast_to_vector
                          ((ArrayRef<double> *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
                std::vector<double,_std::allocator<double>_>::operator=
                          (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
                std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe90);
                ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x66aa40);
                local_b8 = &in_RDI->coefs_;
                local_c0._M_current =
                     (double *)
                     std::vector<double,_std::allocator<double>_>::begin
                               ((vector<double,_std::allocator<double>_> *)
                                CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
                local_c8 = (double *)
                           std::vector<double,_std::allocator<double>_>::end
                                     ((vector<double,_std::allocator<double>_> *)
                                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
                ;
                while (bVar1 = __gnu_cxx::operator!=
                                         ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                           *)in_stack_fffffffffffffe80,
                                          (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                           *)CONCAT44(in_stack_fffffffffffffe7c,
                                                      in_stack_fffffffffffffe78)), bVar1) {
                  local_d0 = __gnu_cxx::
                             __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             ::operator*(&local_c0);
                  dVar7 = sqrt(*local_d0);
                  *local_d0 = dVar7;
                  __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator++(&local_c0);
                }
                QuadTerms::vars1(in_stack_fffffffffffffe98);
                mp::ArrayRef::operator_cast_to_vector
                          ((ArrayRef<int> *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
                piVar8 = local_e8;
                std::vector<int,_std::allocator<int>_>::operator=
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
                           (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe88);
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90);
                ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x66ab70);
                dVar7 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(local_48);
                in_RDI->const_term = dVar7;
                local_128 = local_1c;
                local_124 = local_2c;
                local_120 = &local_128;
                local_118 = 2;
                __l._M_len = in_stack_fffffffffffffea0;
                __l._M_array = piVar8;
                std::vector<int,_std::allocator<int>_>::operator=
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,__l);
                return in_RDI;
              }
              local_58 = local_58 - 1;
              dVar7 = QuadTerms::coef((QuadTerms *)in_stack_fffffffffffffe80,
                                      in_stack_fffffffffffffe7c);
              if (dVar7 < 0.0) break;
              iVar2 = QuadTerms::var1((QuadTerms *)in_stack_fffffffffffffe80,
                                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
              ;
              iVar3 = QuadTerms::var2((QuadTerms *)in_stack_fffffffffffffe80,
                                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
              ;
            } while (iVar2 == iVar3);
            in_RDI->is_from_abs_ = false;
            memset(&in_RDI->coefs_,0,0x18);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)0x66a96e);
            memset(&in_RDI->vars_,0,0x18);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)0x66a992);
            in_RDI->const_term = 0.0;
            in_RDI->coef_extra = 0.0;
            memset(&in_RDI->res_vars_to_delete_,0,0x18);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)0x66a9c6);
            return in_RDI;
          }
        }
      }
    }
  }
  in_RDI->is_from_abs_ = false;
  memset(&in_RDI->coefs_,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x66ac42);
  memset(&in_RDI->vars_,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x66ac66);
  in_RDI->const_term = 0.0;
  in_RDI->coef_extra = 0.0;
  memset(&in_RDI->res_vars_to_delete_,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x66ac9a);
  return in_RDI;
}

Assistant:

ConeArgs CheckNorm2_Pow(const ConInfo& ci, int res_var) {
    const auto& con_pow = MC().template
        GetConstraint<PowConstExpConstraint>(ci);
    const auto arg_pow = con_pow.GetArguments()[0];
    if (0.5 == con_pow.GetParameters()[0] &&     // sqrt(arg_pow)
        MC().HasInitExpression(arg_pow)) {
      const auto& ie_pow = MC().GetInitExpression(arg_pow);
      if (MC().template                          // arg_pow := QFC(...)
          IsConInfoType<QuadraticFunctionalConstraint>(ie_pow)) {
        const auto& con_qdc = MC().template
            GetConstraint<QuadraticFunctionalConstraint>(ie_pow);
        const auto& args_qdc = con_qdc.GetArguments();
        // Allowing a nonneg constant term by adding
        // an auxiliary variable^2
        if (0.0 <= args_qdc.constant_term() &&
            args_qdc.GetBody().GetLinTerms().empty()) {
          const auto& qpterms = args_qdc.GetBody().GetQPTerms();
          for (auto i=qpterms.size(); i--; ) {
            if (qpterms.coef(i) < 0.0 ||
                qpterms.var1(i) != qpterms.var2(i))
              return {};
          }
          ConeArgs result;
          result.coefs_ = qpterms.coefs();
          for (auto& c: result.coefs_)
            c = std::sqrt(c);
          result.vars_ = qpterms.vars1();
          result.const_term = args_qdc.constant_term();
          result.res_vars_to_delete_ = { res_var, arg_pow };
          return result;
        }
      }
    }
    return {};
  }